

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

lu_mem checklist(global_State *g,int maybedead,int tof,GCObject *newl,GCObject *survival,
                GCObject *old,GCObject *reallyold)

{
  lu_mem local_40;
  lu_mem total;
  GCObject *o;
  GCObject *old_local;
  GCObject *survival_local;
  GCObject *newl_local;
  int tof_local;
  int maybedead_local;
  global_State *g_local;
  
  local_40 = 0;
  total = (lu_mem)newl;
  o = old;
  old_local = survival;
  survival_local = newl;
  newl_local._0_4_ = tof;
  newl_local._4_4_ = maybedead;
  _tof_local = g;
  while( true ) {
    if ((GCObject *)total == old_local) {
      total = (lu_mem)old_local;
      while( true ) {
        if ((GCObject *)total == o) {
          total = (lu_mem)o;
          while( true ) {
            if ((GCObject *)total == reallyold) {
              total = (lu_mem)reallyold;
              while( true ) {
                if (total == 0) {
                  return local_40;
                }
                checkobject(_tof_local,(GCObject *)total,0,4);
                incifingray(_tof_local,(GCObject *)total,&local_40);
                if (((int)newl_local == 0) != ((*(byte *)(total + 9) & 0x40) == 0)) break;
                total = *(lu_mem *)total;
              }
              __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x1fc,
                            "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                           );
            }
            checkobject(_tof_local,(GCObject *)total,0,3);
            incifingray(_tof_local,(GCObject *)total,&local_40);
            if (((int)newl_local == 0) != ((*(byte *)(total + 9) & 0x40) == 0)) break;
            total = *(lu_mem *)total;
          }
          __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x1f7,
                        "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                       );
        }
        checkobject(_tof_local,(GCObject *)total,0,1);
        incifingray(_tof_local,(GCObject *)total,&local_40);
        if (((int)newl_local == 0) != ((*(byte *)(total + 9) & 0x40) == 0)) break;
        total = *(lu_mem *)total;
      }
      __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x1f2,
                    "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
                   );
    }
    checkobject(_tof_local,(GCObject *)total,newl_local._4_4_,0);
    incifingray(_tof_local,(GCObject *)total,&local_40);
    if (((int)newl_local == 0) != ((*(byte *)(total + 9) & 0x40) == 0)) break;
    total = *(lu_mem *)total;
  }
  __assert_fail("!tof == !(((o)->marked) & ((1<<(6))))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x1ed,
                "lu_mem checklist(global_State *, int, int, GCObject *, GCObject *, GCObject *, GCObject *)"
               );
}

Assistant:

static lu_mem checklist (global_State *g, int maybedead, int tof,
  GCObject *newl, GCObject *survival, GCObject *old, GCObject *reallyold) {
  GCObject *o;
  lu_mem total = 0;  /* number of object that should be in  gray lists */
  for (o = newl; o != survival; o = o->next) {
    checkobject(g, o, maybedead, G_NEW);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = survival; o != old; o = o->next) {
    checkobject(g, o, 0, G_SURVIVAL);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = old; o != reallyold; o = o->next) {
    checkobject(g, o, 0, G_OLD1);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  for (o = reallyold; o != NULL; o = o->next) {
    checkobject(g, o, 0, G_OLD);
    incifingray(g, o, &total);
    lua_assert(!tof == !tofinalize(o));
  }
  return total;
}